

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

char * INT_create_bridge_action_spec(int stone_id,char *contact)

{
  char *__s;
  char *in_RSI;
  uint in_EDI;
  char *output;
  int size;
  size_t in_stack_ffffffffffffffe0;
  
  strlen(in_RSI);
  __s = (char *)INT_CMmalloc(in_stack_ffffffffffffffe0);
  sprintf(__s,"Bridge Action %d %s",(ulong)in_EDI,in_RSI);
  return __s;
}

Assistant:

char *
INT_create_bridge_action_spec(int stone_id, char *contact)
{
    int size = (int) strlen(contact);
    char *output;
    size += (int) strlen("Bridge Action") + 20;
    output = malloc(size);
    sprintf(output, "Bridge Action %d %s", stone_id, contact);
    return output;
}